

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  JSObject *pJVar5;
  JSValueUnion JVar6;
  uint32_t idx;
  ulong uVar7;
  ulong uVar8;
  int64_t iVar9;
  JSValue JVar10;
  JSValue JVar11;
  ulong uStack_60;
  long local_40;
  ulong local_38;
  
  iVar9 = 3;
  if (argc < 2) {
    JVar6.float64 = 0.0;
  }
  else {
    JVar6 = (JSValueUnion)argv[1].u.ptr;
    iVar9 = argv[1].tag;
  }
  JVar10 = *argv;
  pJVar5 = get_typed_array(ctx,this_val,0);
  if (pJVar5 == (JSObject *)0x0) {
    JVar10 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    JVar11.tag = iVar9;
    JVar11.u.float64 = JVar6.float64;
    iVar4 = JS_ToInt64Sat(ctx,&local_40,JVar11);
    if (iVar4 == 0) {
      if (local_40 < 0) {
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_0015b875;
      }
      if (*(char *)((long)&((((pJVar5->u).map_iterator_data)->cur_record->hash_link).next)->prev + 4
                   ) == '\0') {
        JVar10 = JS_ToObject(ctx,JVar10);
        JVar6 = JVar10.u;
        if ((int)JVar10.tag != 6) {
          if ((ushort)(*(ushort *)((long)JVar6.ptr + 6) - 0x15) < 9) {
            lVar2 = *(long *)(*(long *)(*(long *)((long)JVar6.ptr + 0x30) + 0x18) + 0x30);
            if (*(char *)(lVar2 + 4) != '\0') goto LAB_0015b860;
            uVar8 = (ulong)*(uint *)((long)JVar6.ptr + 0x40);
            if (local_40 <= (long)((pJVar5->u).array.count - uVar8)) {
              uVar1 = (pJVar5->field_0).header.dummy2;
              if (*(ushort *)((long)JVar6.ptr + 6) == uVar1) {
                memmove(((((pJVar5->u).typed_array)->buffer->u).array_buffer)->data +
                        (local_40 << ("includes"[(ulong)uVar1 + 1] & 0x3fU)) +
                        (ulong)((pJVar5->u).typed_array)->offset,
                        (void *)((ulong)*(uint *)(*(long *)((long)JVar6.ptr + 0x30) + 0x20) +
                                *(long *)(lVar2 + 8)),
                        uVar8 << ("includes"[(ulong)uVar1 + 1] & 0x3fU));
LAB_0015b94d:
                JS_FreeValue(ctx,JVar10);
                uStack_60 = 3;
                goto LAB_0015b89a;
              }
              goto LAB_0015b993;
            }
LAB_0015b875:
            JS_ThrowRangeError(ctx,"invalid array length");
          }
          else {
            iVar4 = js_get_length64(ctx,(int64_t *)&local_38,JVar10);
            if (iVar4 == 0) {
              uVar8 = local_38;
              if ((long)((pJVar5->u).array.count - local_38) < local_40) goto LAB_0015b875;
LAB_0015b993:
              uVar7 = 0;
              do {
                idx = (uint32_t)uVar7;
                if ((long)uVar8 <= (long)uVar7) goto LAB_0015b94d;
                JVar11 = JS_GetPropertyUint32(ctx,JVar10,idx);
                if ((int)JVar11.tag == 6) break;
                iVar4 = JS_SetPropertyUint32(ctx,this_val,(int)local_40 + idx,JVar11);
                uVar7 = (ulong)(idx + 1);
              } while (-1 < iVar4);
            }
          }
        }
      }
      else {
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0015b860:
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
      }
    }
    else {
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
  JS_FreeValue(ctx,JVar10);
  uStack_60 = 6;
LAB_0015b89a:
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_60;
  return (JSValue)(auVar3 << 0x40);
}

Assistant:

static JSValue js_typed_array_set(JSContext *ctx,
                                  JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst offset = JS_UNDEFINED;
    if (argc > 1) {
        offset = argv[1];
    }
    return js_typed_array_set_internal(ctx, this_val, argv[0], offset);
}